

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void * ma_dr_mp3_malloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pvVar1 = malloc(sz);
    return pvVar1;
  }
  if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
    pvVar1 = (*pAllocationCallbacks->onMalloc)(sz,pAllocationCallbacks->pUserData);
    return pvVar1;
  }
  if (pAllocationCallbacks->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
    pvVar1 = (*pAllocationCallbacks->onRealloc)((void *)0x0,sz,pAllocationCallbacks->pUserData);
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

MA_API void* ma_dr_mp3_malloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        return ma_dr_mp3__malloc_from_callbacks(sz, pAllocationCallbacks);
    } else {
        return ma_dr_mp3__malloc_default(sz, NULL);
    }
}